

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Int_t * Lms_GiaCollectUsefulCos(Lms_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *__ptr;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  iVar7 = p->vTtMem->nEntries;
  lVar12 = (long)iVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar7 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar4;
  lVar12 = p->pGia->vCos->nSize + lVar12;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = (int)lVar12;
  iVar8 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar8 = iVar7;
  }
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = iVar7;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
    pVVar5->pArray = piVar4;
    pVVar5->nSize = iVar7;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0xff,lVar12 * 4);
      goto LAB_002fc15b;
    }
  }
  piVar4 = (int *)0x0;
LAB_002fc15b:
  __ptr = Lms_GiaCountTruths(p);
  iVar8 = __ptr->nSize;
  lVar12 = (long)iVar8;
  if (lVar12 < 1) {
    iVar9 = 0;
  }
  else {
    piVar6 = __ptr->pArray;
    lVar11 = 0;
    iVar9 = 0;
    do {
      iVar1 = piVar6[lVar11];
      if (iVar1 < 1) {
        __assert_fail("Entry > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x4ba,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
      }
      Vec_IntPush(p_00,iVar9);
      iVar9 = iVar9 + iVar1 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar12 != lVar11);
  }
  Vec_IntPush(p_00,iVar9);
  if (__ptr->nCap < iVar8) {
    if (__ptr->pArray == (int *)0x0) {
      piVar6 = (int *)malloc(lVar12 * 4);
    }
    else {
      piVar6 = (int *)realloc(__ptr->pArray,lVar12 * 4);
    }
    __ptr->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    __ptr->nCap = iVar8;
  }
  if (0 < iVar8) {
    memset(__ptr->pArray,0,lVar12 << 2);
  }
  pVVar2 = p->vTruthIds;
  iVar9 = pVVar2->nSize;
  if (0 < iVar9) {
    piVar6 = pVVar2->pArray;
    lVar12 = 0;
    do {
      iVar1 = piVar6[lVar12];
      lVar11 = (long)iVar1;
      if (-1 < lVar11) {
        if ((p_00->nSize <= iVar1) || (iVar8 <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar3 = __ptr->pArray;
        uVar10 = piVar3[lVar11] + p_00->pArray[lVar11];
        if (((int)uVar10 < 0) || (iVar7 <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (piVar4[uVar10] != -1) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x4c7,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
        }
        piVar4[uVar10] = (int)lVar12;
        piVar3 = piVar3 + lVar11;
        *piVar3 = *piVar3 + 1;
        iVar9 = pVVar2->nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar9);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar5;
}

Assistant:

Vec_Int_t * Lms_GiaCollectUsefulCos( Lms_Man_t * p )
{
    Vec_Int_t * vBegins = Vec_IntAlloc( Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vUseful = Vec_IntStartFull( Gia_ManCoNum(p->pGia) + Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vCounts = Lms_GiaCountTruths( p );
    int i, Entry, * pPlace, SumTotal = 0;
    // mark up the place for POs
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        assert( Entry > 0 );
        Vec_IntPush( vBegins, SumTotal );
        SumTotal += Entry + 1;
//        printf( "%d ", Entry );
    }
    Vec_IntPush( vBegins, SumTotal );
    // fill out POs in their places
    Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
    {
        if ( Entry < 0 )
            continue;
        pPlace = Vec_IntEntryP( vUseful, Vec_IntEntry(vBegins, Entry) + Vec_IntEntry(vCounts, Entry) );
        assert( *pPlace == -1 );
        *pPlace = i;
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    }
    Vec_IntFree( vBegins );
    Vec_IntFree( vCounts );
    return vUseful;
}